

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O1

void __thiscall GraphTestCycleInEdgesButNotInNodes1::Run(GraphTestCycleInEdgesButNotInNodes1 *this)

{
  Test *pTVar1;
  bool bVar2;
  int iVar3;
  Node *node;
  string err;
  string local_68;
  string local_48;
  
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  AssertParse(&(this->super_GraphTest).super_StateTestWithBuiltinRules.state_,"build a b: cat a\n",
              (ManifestParserOptions)0x0);
  pTVar1 = g_current_test;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"b","");
  node = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_68);
  bVar2 = DependencyScan::RecomputeDirty(&(this->super_GraphTest).scan_,node,&local_48);
  testing::Test::Check
            (pTVar1,!bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
             ,0x164,"scan_.RecomputeDirty(GetNode(\"b\"), &err)");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  pTVar1 = g_current_test;
  iVar3 = std::__cxx11::string::compare((char *)&local_48);
  bVar2 = testing::Test::Check
                    (pTVar1,iVar3 == 0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
                     ,0x165,"\"dependency cycle: a -> a\" == err");
  if (!bVar2) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                             local_48.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

TEST_F(GraphTest, CycleInEdgesButNotInNodes1) {
  string err;
  AssertParse(&state_,
"build a b: cat a\n");
  EXPECT_FALSE(scan_.RecomputeDirty(GetNode("b"), &err));
  ASSERT_EQ("dependency cycle: a -> a", err);
}